

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O3

size_t __thiscall
bidfx_public_api::tools::ByteBuffer::ReadBytes(ByteBuffer *this,OutputStream *output_buf,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  uchar *extraout_RDX;
  uchar *puVar3;
  size_t sVar4;
  
  CheckBufferHasData(this,len);
  sVar4 = len;
  if (len != 0) {
    do {
      CheckBufferHasData(this,1);
      sVar1 = this->reader_index_;
      if (this->capacity_ < sVar1 + 1) {
        uVar2 = 0;
        puVar3 = extraout_RDX;
      }
      else {
        puVar3 = this->buf_;
        uVar2 = CONCAT71((int7)(sVar1 >> 8),puVar3[sVar1]);
      }
      this->reader_index_ = sVar1 + 1;
      (**output_buf->_vptr_OutputStream)(output_buf,uVar2 & 0xff,puVar3,uVar2);
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  return len;
}

Assistant:

size_t ByteBuffer::ReadBytes(OutputStream& output_buf, size_t len)
{
    CheckBufferHasData(len);
    size_t num_bytes = 0;
    for (; num_bytes < len; num_bytes++)
    {
        output_buf.WriteByte(GetNextByte());
    }
    return num_bytes;
}